

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_mullhwu(DisasContext_conflict10 *ctx)

{
  uint uVar1;
  
  uVar1 = ctx->opcode;
  gen_405_mulladd_insn
            (ctx,8,0xc,uVar1 >> 0x10 & 0x1f,uVar1 >> 0xb & 0x1f,uVar1 >> 0x15 & 0x1f,uVar1 & 1);
  return;
}

Assistant:

static void gen_mfdcr(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv dcrn;

    CHK_SV;
    dcrn = tcg_const_tl(tcg_ctx, SPR(ctx->opcode));
    gen_helper_load_dcr(tcg_ctx, cpu_gpr[rD(ctx->opcode)], tcg_ctx->cpu_env, dcrn);
    tcg_temp_free(tcg_ctx, dcrn);
}